

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<bool,_allocator_default<bool>_>::alloc
          (array<bool,_allocator_default<bool>_> *this,int new_len)

{
  bool *pbVar1;
  undefined4 in_ESI;
  long *in_RDI;
  int i;
  int end;
  bool *new_list;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  int iVar3;
  int local_20;
  
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  pbVar1 = allocator_default<bool>::alloc_array(0);
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    iVar3 = *(int *)((long)in_RDI + 0xc);
  }
  else {
    iVar3 = (int)in_RDI[1];
  }
  for (local_20 = 0; local_20 < iVar3; local_20 = local_20 + 1) {
    pbVar1[local_20] = (bool)(*(byte *)(*in_RDI + (long)local_20) & 1);
  }
  allocator_default<bool>::free_array((bool *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    uVar2 = *(undefined4 *)((long)in_RDI + 0xc);
  }
  else {
    uVar2 = (undefined4)in_RDI[1];
  }
  *(undefined4 *)((long)in_RDI + 0xc) = uVar2;
  *in_RDI = (long)pbVar1;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}